

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_6,_5>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int row;
  long lVar2;
  float fVar3;
  Mat2x3 m;
  Vector<float,_3> res;
  Type in1;
  Matrix<float,_3,_2> local_78;
  float afStack_60 [6];
  int aiStack_48 [6];
  float local_30 [6];
  Matrix<float,_2,_2> local_18;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    do {
      fVar3 = 1.0;
      if (lVar2 != 0) {
        fVar3 = 0.0;
      }
      local_78.m_data.m_data[0].m_data[lVar2] = fVar3;
      fVar3 = 1.0;
      if (lVar2 != 1) {
        fVar3 = 0.0;
      }
      afStack_60[lVar2 + -3] = fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    local_78.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_78.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_78.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_78.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  }
  else {
    local_78.m_data.m_data[0].m_data[0] = 0.0;
    local_78.m_data.m_data[0].m_data[1] = 0.0;
    local_78.m_data.m_data[0].m_data[2] = 0.0;
    local_78.m_data.m_data[1].m_data[0] = 0.0;
    local_78.m_data.m_data[1].m_data[1] = 0.0;
    local_78.m_data.m_data[1].m_data[2] = 0.0;
    lVar2 = 0;
    do {
      fVar3 = (float)(&DAT_00b1f8b4)[lVar2 * 2];
      local_78.m_data.m_data[0].m_data[lVar2] =
           (float)(&sr::(anonymous_namespace)::s_constInMat2x3)[lVar2 * 2];
      afStack_60[lVar2 + -3] = fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_18.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
    local_18.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    local_18.m_data.m_data[1].m_data[0] = (float)uVar1;
    local_18.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    local_18.m_data.m_data[0].m_data[0] = 0.8;
    local_18.m_data.m_data[0].m_data[1] = 0.5;
    local_18.m_data.m_data[1].m_data[0] = 0.1;
    local_18.m_data.m_data[1].m_data[1] = -0.9;
  }
  tcu::operator*(&local_78,&local_18);
  afStack_60[4] = 0.0;
  afStack_60[2] = 0.0;
  afStack_60[3] = 0.0;
  lVar2 = 0;
  do {
    afStack_60[lVar2 + 2] = local_30[lVar2] + local_30[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  aiStack_48[2] = 0;
  aiStack_48[3] = 1;
  aiStack_48[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[aiStack_48[lVar2]] = afStack_60[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}